

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kernel_timeout.h
# Opt level: O2

timespec __thiscall
absl::synchronization_internal::KernelTimeout::MakeAbsTimespec(KernelTimeout *this)

{
  ulong uVar1;
  undefined8 in_R8;
  undefined8 in_R9;
  timespec tVar2;
  
  uVar1 = this->ns_;
  if (uVar1 == 0) {
    raw_logging_internal::RawLog
              (kError,"kernel_timeout.h",0x85,
               "Tried to create a timespec from a non-timeout; never do this.",in_R8,in_R9,0);
    uVar1 = 0x7fffffffffffffff;
  }
  if ((long)uVar1 < 1) {
    uVar1 = 0;
  }
  tVar2.tv_sec = uVar1 / 1000000000;
  tVar2.tv_nsec = uVar1 % 1000000000;
  return tVar2;
}

Assistant:

inline struct timespec KernelTimeout::MakeAbsTimespec() {
  int64_t n = ns_;
  static const int64_t kNanosPerSecond = 1000 * 1000 * 1000;
  if (n == 0) {
    ABSL_RAW_LOG(
        ERROR, "Tried to create a timespec from a non-timeout; never do this.");
    // But we'll try to continue sanely.  no-timeout ~= saturated timeout.
    n = (std::numeric_limits<int64_t>::max)();
  }

  // Kernel APIs validate timespecs as being at or after the epoch,
  // despite the kernel time type being signed.  However, no one can
  // tell the difference between a timeout at or before the epoch (since
  // all such timeouts have expired!)
  if (n < 0) n = 0;

  struct timespec abstime;
  int64_t seconds = (std::min)(n / kNanosPerSecond,
                               int64_t{(std::numeric_limits<time_t>::max)()});
  abstime.tv_sec = static_cast<time_t>(seconds);
  abstime.tv_nsec = static_cast<decltype(abstime.tv_nsec)>(n % kNanosPerSecond);
  return abstime;
}